

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall
IR::IRBuilder::cjump(IRBuilder *this,Expr *cond,BasicBlock *iftrue,BasicBlock *iffalse)

{
  BasicBlock *pBVar1;
  pointer ppSVar2;
  Function *pFVar3;
  int iVar4;
  _Fwd_list_node_base *p_Var5;
  _Fwd_list_node_base *local_30;
  
  pBVar1 = this->block_;
  ppSVar2 = (pBVar1->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
            super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((((pBVar1->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
        super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.super__Vector_impl_data.
        _M_start != ppSVar2) && (iVar4 = (*ppSVar2[-1]->_vptr_Stmt[3])(), (char)iVar4 != '\0')) &&
     ((pBVar1->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
      super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1] != (Stmt *)0x0)) {
    return;
  }
  pFVar3 = this->function_;
  p_Var5 = (_Fwd_list_node_base *)operator_new(0x28);
  p_Var5->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var5[2]._M_next = (_Fwd_list_node_base *)iffalse;
  p_Var5[3]._M_next = (_Fwd_list_node_base *)iftrue;
  p_Var5[4]._M_next = (_Fwd_list_node_base *)cond;
  p_Var5[1]._M_next = (_Fwd_list_node_base *)&PTR__Stmt_00138528;
  p_Var5->_M_next =
       (pFVar3->cjumps_).super__Fwd_list_base<IR::CJump,_std::allocator<IR::CJump>_>._M_impl._M_head
       ._M_next;
  (pFVar3->cjumps_).super__Fwd_list_base<IR::CJump,_std::allocator<IR::CJump>_>._M_impl._M_head.
  _M_next = p_Var5;
  local_30 = (this->function_->cjumps_).super__Fwd_list_base<IR::CJump,_std::allocator<IR::CJump>_>.
             _M_impl._M_head._M_next + 1;
  std::vector<IR::Stmt*,std::allocator<IR::Stmt*>>::emplace_back<IR::Stmt*>
            ((vector<IR::Stmt*,std::allocator<IR::Stmt*>> *)this->block_,(Stmt **)&local_30);
  return;
}

Assistant:

void IRBuilder::cjump(const Expr* cond, BasicBlock* iftrue,
                      BasicBlock* iffalse) {
  if (block_->isTerminated()) return;
  function_->cjumps_.emplace_front(cond, iftrue, iffalse);
  block_->push_back(&function_->cjumps_.front());
}